

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

float64 vector_dist_maha(float32 *vec,float32 *mean,float32 *varinv,float64 loginvdet,int32 len)

{
  ulong uVar1;
  
  if (0 < len) {
    uVar1 = 0;
    do {
      loginvdet = (float64)((double)loginvdet -
                           (double)((float)vec[uVar1] - (float)mean[uVar1]) *
                           (double)((float)vec[uVar1] - (float)mean[uVar1]) *
                           (double)(float)varinv[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
  }
  return loginvdet;
}

Assistant:

float64
vector_dist_maha(float32 * vec, float32 * mean, float32 * varinv,
                 float64 loginvdet, int32 len)
{
    float64 dist, diff;
    int32 i;

    dist = loginvdet;
    for (i = 0; i < len; i++) {
        diff = (vec[i] - mean[i]);
        dist -= diff * diff * varinv[i];
    }

    return dist;
}